

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::HandleBadFullItem
          (cmComputeLinkInformation *this,LinkEntry *entry,string *file)

{
  cmake *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  pointer this_00;
  cmState *pcVar4;
  ostream *poVar5;
  string *psVar6;
  PolicyID id;
  PolicyID id_00;
  undefined1 local_510 [16];
  string local_500;
  string local_4e0;
  undefined1 local_4c0 [8];
  ostringstream e;
  undefined1 local_348 [16];
  string local_338;
  string local_318;
  undefined1 local_2f8 [8];
  ostringstream w;
  allocator<char> local_179;
  string local_178;
  undefined1 local_158 [8];
  string wid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_f0;
  undefined1 local_c0 [8];
  LinkEntry fileEntry;
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  local_50 [8];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  _Base_ptr local_40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  i;
  string *item;
  string *file_local;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry;
  local_38._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Depends);
  local_40 = (_Base_ptr)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->Depends);
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_38,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_40,i._M_current);
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->Depends);
  bVar2 = __gnu_cxx::operator!=(&local_30,&local_48);
  if (bVar2) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>(local_50,&local_30);
    fileEntry.Feature.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::erase(&this->Depends,(const_iterator)local_50);
  }
  cmComputeLinkDepends::LinkEntry::LinkEntry((LinkEntry *)local_c0,entry);
  std::__cxx11::string::string((string *)&local_110,(string *)file);
  wid.field_2._8_8_ = 0;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)((long)&wid.field_2 + 8));
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&local_f0,&local_110,(cmListFileBacktrace *)((long)&wid.field_2 + 8));
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )local_c0,&local_f0);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&local_f0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)((long)&wid.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_110);
  AddUserItem(this,(LinkEntry *)local_c0,false);
  this_00 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
            operator->(&this->OrderLinkerSearchPath);
  cmOrderDirectories::AddLinkLibrary(this_00,i._M_current);
  PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0008(this->Target);
  switch(PVar3) {
  case WARN:
    cmStrCat<char_const(&)[23],std::__cxx11::string_const&>
              ((string *)local_158,(char (*) [23])"CMP0008-WARNING-GIVEN-",i._M_current);
    pcVar4 = cmake::GetState(this->CMakeInstance);
    bVar2 = cmState::GetGlobalPropertyAsBool(pcVar4,(string *)local_158);
    if (!bVar2) {
      pcVar4 = cmake::GetState(this->CMakeInstance);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"1",&local_179);
      cmState::SetGlobalProperty(pcVar4,(string *)local_158,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator(&local_179);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_318,(cmPolicies *)0x8,id);
      poVar5 = std::operator<<((ostream *)local_2f8,(string *)&local_318);
      poVar5 = std::operator<<(poVar5,"\nTarget \"");
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5,"\" links to item\n  ");
      poVar5 = std::operator<<(poVar5,(string *)i._M_current);
      std::operator<<(poVar5,"\nwhich is a full-path but not a valid library file name.");
      std::__cxx11::string::~string((string *)&local_318);
      pcVar1 = this->CMakeInstance;
      std::__cxx11::ostringstream::str();
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_348);
      cmake::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)(local_348 + 0x10),
                          (cmListFileBacktrace *)local_348);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_348);
      std::__cxx11::string::~string((string *)(local_348 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
    }
    std::__cxx11::string::~string((string *)local_158);
  case OLD:
    break;
  case NEW:
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_4e0,(cmPolicies *)0x8,id_00);
    poVar5 = std::operator<<((ostream *)local_4c0,(string *)&local_4e0);
    poVar5 = std::operator<<(poVar5,"\nTarget \"");
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    poVar5 = std::operator<<(poVar5,"\" links to item\n  ");
    poVar5 = std::operator<<(poVar5,(string *)i._M_current);
    std::operator<<(poVar5,"\nwhich is a full-path but not a valid library file name.");
    std::__cxx11::string::~string((string *)&local_4e0);
    pcVar1 = this->CMakeInstance;
    std::__cxx11::ostringstream::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_510);
    cmake::IssueMessage(pcVar1,FATAL_ERROR,(string *)(local_510 + 0x10),
                        (cmListFileBacktrace *)local_510);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_510);
    std::__cxx11::string::~string((string *)(local_510 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
  }
  cmComputeLinkDepends::LinkEntry::~LinkEntry((LinkEntry *)local_c0);
  return;
}

Assistant:

void cmComputeLinkInformation::HandleBadFullItem(LinkEntry const& entry,
                                                 std::string const& file)
{
  std::string const& item = entry.Item.Value;
  // Do not depend on things that do not exist.
  auto i = std::find(this->Depends.begin(), this->Depends.end(), item);
  if (i != this->Depends.end()) {
    this->Depends.erase(i);
  }

  // Tell the linker to search for the item and provide the proper
  // path for it.  Do not contribute to any CMP0003 warning (do not
  // put in OldLinkDirItems or OldUserFlagItems).
  LinkEntry fileEntry{ entry };
  fileEntry.Item = file;
  this->AddUserItem(fileEntry, false);
  this->OrderLinkerSearchPath->AddLinkLibrary(item);

  // Produce any needed message.
  switch (this->Target->GetPolicyStatusCMP0008()) {
    case cmPolicies::WARN: {
      // Print the warning at most once for this item.
      std::string wid = cmStrCat("CMP0008-WARNING-GIVEN-", item);
      if (!this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(wid)) {
        this->CMakeInstance->GetState()->SetGlobalProperty(wid, "1");
        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0008) << "\n"
             "Target \"" << this->Target->GetName() << "\" links to item\n"
             "  " << item << "\n"
             "which is a full-path but not a valid library file name.";
        /* clang-format on */
        this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                          this->Target->GetBacktrace());
      }
    }
      CM_FALLTHROUGH;
    case cmPolicies::OLD: // NOLINT(bugprone-branch-clone)
      // OLD behavior does not warn.
      break;
    case cmPolicies::NEW:
      // NEW behavior will not get here.
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS: {
      std::ostringstream e;
      /* clang-format off */
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0008) << "\n"
             "Target \"" << this->Target->GetName() << "\" links to item\n"
             "  " << item << "\n"
             "which is a full-path but not a valid library file name.";
      /* clang-format on */
      this->CMakeInstance->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                        this->Target->GetBacktrace());
    } break;
  }
}